

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void xmlParserPrintFileContextInternal
               (xmlParserInputPtr input,xmlGenericErrorFunc channel,void *data)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  uint uVar7;
  xmlChar *pxVar8;
  xmlChar content [81];
  xmlChar local_78 [88];
  
  if (input != (xmlParserInputPtr)0x0) {
    pxVar8 = local_78;
    pxVar2 = input->cur;
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar3 = input->base;
      pxVar5 = pxVar2;
      for (pxVar4 = pxVar2;
          (pxVar3 < pxVar4 && ((*pxVar4 == '\r' || (pxVar5 = pxVar4, *pxVar4 == '\n'))));
          pxVar4 = pxVar4 + -1) {
        pxVar5 = pxVar3;
      }
      if (pxVar3 < pxVar5) {
        uVar7 = 1;
        do {
          if (((*pxVar5 == '\n') || (*pxVar5 == '\r')) || (pxVar5 = pxVar5 + -1, 0x4f < uVar7))
          break;
          uVar7 = uVar7 + 1;
        } while (pxVar3 < pxVar5);
      }
      if ((*pxVar5 == '\r') || (*pxVar5 == '\n')) {
        pxVar5 = pxVar5 + 1;
      }
      for (lVar6 = 0;
          ((xVar1 = pxVar5[lVar6], xVar1 != '\0' && (xVar1 != '\n')) &&
          ((xVar1 != '\r' && ((uint)lVar6 < 0x50)))); lVar6 = lVar6 + 1) {
        local_78[lVar6] = xVar1;
      }
      local_78[lVar6] = '\0';
      (*channel)(data,"%s\n",local_78);
      if ((int)pxVar2 != (int)pxVar5) {
        lVar6 = 0;
        pxVar8 = local_78;
        do {
          if ((int)lVar6 == 0x4f) goto LAB_00146c20;
          if (local_78[lVar6] != '\t') {
            if (local_78[lVar6] == '\0') break;
            local_78[lVar6] = ' ';
          }
          pxVar8 = pxVar8 + 1;
          lVar6 = lVar6 + 1;
        } while ((int)pxVar2 - (int)pxVar5 != (int)lVar6);
        pxVar8 = local_78 + lVar6;
      }
LAB_00146c20:
      pxVar8[0] = '^';
      pxVar8[1] = '\0';
      (*channel)(data,"%s\n",local_78);
    }
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc channel, void *data ) {
    const xmlChar *cur, *base;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if ((input == NULL) || (input->cur == NULL))
        return;

    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n++ < (sizeof(content)-1)) && (cur > base) &&
	   (*(cur) != '\n') && (*(cur) != '\r'))
        cur--;
    if ((*(cur) == '\n') || (*(cur) == '\r')) cur++;
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    ctnt = content;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') &&
	   (*(cur) != '\r') && (n < sizeof(content)-1)) {
		*ctnt++ = *cur++;
	n++;
    }
    *ctnt = 0;
    /* print out the selected text */
    channel(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    channel(data ,"%s\n", content);
}